

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O3

uint nullcFindFunctionIndex(char *name)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  int *piVar4;
  uint uVar5;
  ulong uVar6;
  
  if (NULLC::linker == 0) {
    pcVar3 = "ERROR: NULLC cannot find linked code";
  }
  else if (name == (char *)0x0) {
    pcVar3 = "ERROR: function name is \'null\'";
  }
  else {
    uVar2 = NULLC::GetStringHash(name);
    uVar1 = *(uint *)(NULLC::linker + 0x24c);
    pcVar3 = "ERROR: function with such name cannot be found";
    if ((ulong)uVar1 != 0) {
      piVar4 = (int *)(*(long *)(NULLC::linker + 0x240) + 0x18);
      uVar5 = 0xffffffff;
      uVar6 = 0;
      do {
        if ((*piVar4 != 0) && (piVar4[0x19] == uVar2)) {
          if (uVar5 != 0xffffffff) {
            NULLC::nullcLastError = "ERROR: there is more than one function with the same name";
            return 0xffffffff;
          }
          uVar5 = (uint)uVar6;
        }
        uVar6 = uVar6 + 1;
        piVar4 = piVar4 + 0x25;
      } while (uVar1 != uVar6);
      if (uVar5 != 0xffffffff) {
        if (uVar1 <= uVar5) {
          __assert_fail("index < count",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x7f,
                        "T &FastVector<ExternFuncInfo>::operator[](unsigned int) [T = ExternFuncInfo, zeroNewMemory = false, skipConstructor = false]"
                       );
        }
        if (*(char *)(*(long *)(NULLC::linker + 0x240) + 0x35 + (ulong)uVar5 * 0x94) == '\0') {
          return uVar5;
        }
        pcVar3 = "ERROR: function uses context, which is unavailable";
      }
    }
  }
  NULLC::nullcLastError = pcVar3;
  return 0xffffffff;
}

Assistant:

unsigned nullcFindFunctionIndex(const char* name)
{
	using namespace NULLC;

	if(!linker)
	{
		nullcLastError = "ERROR: NULLC cannot find linked code";
		return ~0u;
	}
	if(!name)
	{
		nullcLastError = "ERROR: function name is 'null'";
		return ~0u;
	}
	unsigned hash = GetStringHash(name);
	unsigned index = ~0u;
	for(unsigned i = 0; i < linker->exFunctions.size(); i++)
	{
		if(linker->exFunctions[i].isVisible && linker->exFunctions[i].nameHash == hash)
		{
			if(index != ~0u)
			{
				nullcLastError = "ERROR: there is more than one function with the same name";
				return ~0u;
			}
			index = i;
		}
	}
	if(index == ~0u)
	{
		nullcLastError = "ERROR: function with such name cannot be found";
		return ~0u;
	}
	if(linker->exFunctions[index].funcCat != ExternFuncInfo::NORMAL)
	{
		nullcLastError = "ERROR: function uses context, which is unavailable";
		return ~0u;
	}
	return index;
}